

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_object_manager.cpp
# Opt level: O0

void __thiscall sc_core::sc_object_manager::remove_event(sc_object_manager *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>_>
  *in_RDI;
  bool bVar3;
  iterator it;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>
  local_18 [3];
  
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>
  ::_Rb_tree_iterator(local_18);
  local_20 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>_>
             ::find(in_RDI,(key_type *)0x2b5193);
  local_18[0]._M_node = local_20;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>_>
       ::end(in_RDI);
  bVar1 = std::operator!=(local_18,&local_28);
  bVar3 = false;
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>
                           *)0x2b51dc);
    bVar3 = (ppVar2->second).m_name_origin == SC_NAME_EVENT;
  }
  if (bVar3) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>
                           *)0x2b51fb);
    (ppVar2->second).m_element_p = (void *)0x0;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>
                           *)0x2b520d);
    (ppVar2->second).m_name_origin = SC_NAME_NONE;
  }
  return;
}

Assistant:

void
sc_object_manager::remove_event(const std::string& name)
{
    instance_table_t::iterator it;     // instance table iterator.
    it = m_instance_table.find(name);
    if(it != m_instance_table.end()
       && it->second.m_name_origin == SC_NAME_EVENT)
    {
        it->second.m_element_p = NULL;
        it->second.m_name_origin = SC_NAME_NONE;
    }
}